

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O1

int __thiscall ON_RevSurface::Degree(ON_RevSurface *this,int dir)

{
  int iVar1;
  
  iVar1 = 1 - dir;
  if (this->m_bTransposed == false) {
    iVar1 = dir;
  }
  if (iVar1 != 0) {
    if ((iVar1 == 1) && (this->m_curve != (ON_Curve *)0x0)) {
      iVar1 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2c])();
      return iVar1;
    }
    return 0;
  }
  return 2;
}

Assistant:

int ON_RevSurface::Degree( int dir ) const
{
  int span_degree = 0;
  if ( m_bTransposed )
    dir = 1-dir;
  if ( dir == 0  )
    span_degree = 2;
  else if ( dir == 1 && m_curve )
    span_degree = m_curve->Degree();
  return span_degree;
}